

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkStartFrom(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func)

{
  uint fCopyName;
  int iVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Vec_t *pVVar6;
  Abc_Cex_t *pAVar7;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  Mio_Library_t *pLib;
  float fVar10;
  int local_38;
  int i;
  int fCopyNames;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_NtkFunc_t Func_local;
  Abc_NtkType_t Type_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    fCopyName = (uint)(Type != ABC_NTK_NETLIST);
    pNtk_local = Abc_NtkAlloc(Type,Func,1);
    pNtk_local->nConstrs = pNtk->nConstrs;
    pNtk_local->nBarBufs = pNtk->nBarBufs;
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar3;
    Abc_NtkCleanCopy(pNtk);
    iVar1 = Abc_NtkIsStrash(pNtk);
    if ((iVar1 != 0) && (iVar1 = Abc_NtkIsStrash(pNtk_local), iVar1 != 0)) {
      pAVar4 = Abc_AigConst1(pNtk_local);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_6).pCopy = pAVar4;
    }
    for (local_38 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_38 < iVar1; local_38 = local_38 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_38);
      Abc_NtkDupObj(pNtk_local,pAVar4,fCopyName);
    }
    for (local_38 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_38 < iVar1; local_38 = local_38 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,local_38);
      Abc_NtkDupObj(pNtk_local,pAVar4,fCopyName);
    }
    for (local_38 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_38 < iVar1; local_38 = local_38 + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_38);
      Abc_NtkDupBox(pNtk_local,pAVar4,fCopyName);
    }
    for (local_38 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_38 < iVar1; local_38 = local_38 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,local_38);
      *(uint *)((long)(pAVar4->field_6).pTemp + 0x14) =
           *(uint *)((long)(pAVar4->field_6).pTemp + 0x14) & 0xfff |
           *(uint *)&pAVar4->field_0x14 & 0xfffff000;
    }
    Abc_ManTimeDup(pNtk,pNtk_local);
    if (pNtk->vOnehots != (Vec_Ptr_t *)0x0) {
      pVVar6 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      pNtk_local->vOnehots = (Vec_Ptr_t *)pVVar6;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar7 = pNtk->pSeqModel;
      iVar1 = Abc_NtkLatchNum(pNtk);
      pAVar7 = Abc_CexDup(pAVar7,iVar1);
      pNtk_local->pSeqModel = pAVar7;
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      pVVar8 = Vec_IntDup(pNtk->vObjPerm);
      pNtk_local->vObjPerm = pVVar8;
    }
    pNtk_local->AndGateDelay = pNtk->AndGateDelay;
    if ((((pNtk_local->pManTime != (Abc_ManTime_t *)0x0) &&
         (pvVar9 = Abc_FrameReadLibGen(), pvVar9 != (void *)0x0)) &&
        (pNtk_local->AndGateDelay == 0.0)) && (!NAN(pNtk_local->AndGateDelay))) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      fVar10 = Mio_LibraryReadDelayAigNode(pLib);
      pNtk_local->AndGateDelay = fVar10;
    }
    if (((pNtk->AndGateDelay != 0.0) || (NAN(pNtk->AndGateDelay))) &&
       ((pNtk->pManTime != (Abc_ManTime_t *)0x0 &&
        ((pNtk->ntkType != ABC_NTK_STRASH && (Type == ABC_NTK_STRASH)))))) {
      for (local_38 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_38 < iVar1; local_38 = local_38 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,local_38);
        fVar10 = Abc_NodeReadArrivalWorst(pAVar4);
        fVar10 = Abc_MaxFloat(0.0,fVar10);
        *(uint *)((long)(pAVar4->field_6).pTemp + 0x14) =
             *(uint *)((long)(pAVar4->field_6).pTemp + 0x14) & 0xfff |
             (int)(fVar10 / pNtk->AndGateDelay) << 0xc;
      }
    }
    iVar1 = Abc_NtkCiNum(pNtk);
    iVar2 = Abc_NtkCiNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa1,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
    iVar1 = Abc_NtkCoNum(pNtk);
    iVar2 = Abc_NtkCoNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa2,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
    iVar1 = Abc_NtkLatchNum(pNtk);
    iVar2 = Abc_NtkLatchNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa3,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFrom( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj;
    int fCopyNames, i;
    if ( pNtk == NULL )
        return NULL;
    // decide whether to copy the names
    fCopyNames = ( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );
    // transfer logic level
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy->Level = pObj->Level;
    // transfer the names
//    Abc_NtkTrasferNames( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    if ( pNtk->vOnehots )
        pNtkNew->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    if ( pNtk->pSeqModel )
        pNtkNew->pSeqModel = Abc_CexDup( pNtk->pSeqModel, Abc_NtkLatchNum(pNtk) );
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    if ( pNtkNew->pManTime && Abc_FrameReadLibGen() && pNtkNew->AndGateDelay == 0.0 )
        pNtkNew->AndGateDelay = Mio_LibraryReadDelayAigNode((Mio_Library_t *)Abc_FrameReadLibGen());
    // initialize logic level of the CIs
    if ( pNtk->AndGateDelay != 0.0 && pNtk->pManTime != NULL && pNtk->ntkType != ABC_NTK_STRASH && Type == ABC_NTK_STRASH )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pCopy->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pObj)) / pNtk->AndGateDelay);
    }
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkCiNum(pNtk)    == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtk)    == Abc_NtkCoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}